

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O3

IConnection * __thiscall
tonk::ConnectionAddrMap::FindByAddr(ConnectionAddrMap *this,UDPAddress *addr)

{
  atomic<int> *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  raw_node *prVar10;
  uint uVar11;
  IConnection *pIVar12;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->AddressMapLock);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  bVar5 = asio::ip::operator==(addr,&this->RecentAddress);
  if (bVar5) {
    pIVar12 = this->RecentConnection;
    if (pIVar12 != (IConnection *)0x0) {
LAB_0012a08f:
      LOCK();
      paVar1 = &(pIVar12->SelfRefCount).RefCount;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      goto LAB_0012a16d;
    }
  }
  else if ((this->AddressMap).TheMap.m_num_valid != 0) {
    uVar7 = HashUDPAddress(addr);
    prVar10 = (this->AddressMap).TheMap.m_values;
    uVar11 = (uint)((int)uVar7 * -0x61c88647) >>
             ((byte)(this->AddressMap).TheMap.m_hash_shift & 0x1f);
    uVar9 = (ulong)uVar11;
    if (prVar10[uVar9].m_bits[0x28] != '\0') {
      prVar10 = prVar10 + uVar9;
      bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar10,addr);
      uVar8 = uVar11;
      if (!bVar5) {
        pIVar12 = (IConnection *)0x0;
        do {
          if ((int)uVar9 == 0) {
            uVar9 = (ulong)((this->AddressMap).TheMap.m_values_count - 1);
            prVar10 = (this->AddressMap).TheMap.m_values + uVar9;
          }
          else {
            uVar9 = (ulong)((int)uVar9 - 1);
            prVar10 = prVar10 + -1;
          }
          if (((uint)uVar9 == uVar11) ||
             (*(char *)((long)((endpoint *)prVar10->m_bits + 1) + 0xc) == '\0')) goto LAB_0012a16d;
          bVar5 = asio::ip::operator==((basic_endpoint<asio::ip::udp> *)prVar10,addr);
          uVar8 = (uint)uVar9;
        } while (!bVar5);
      }
      if ((-1 < (int)uVar8) &&
         (pIVar12 = *(IConnection **)((this->AddressMap).TheMap.m_values[uVar8].m_bits + 0x20),
         pIVar12 != (IConnection *)0x0)) {
        uVar2 = *(undefined8 *)&(addr->impl_).data_;
        uVar3 = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
        uVar4 = *(undefined8 *)((long)&(addr->impl_).data_ + 0x14);
        *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0xc) =
             *(undefined8 *)((long)&(addr->impl_).data_ + 0xc);
        *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0x14) = uVar4;
        *(undefined8 *)&(this->RecentAddress).impl_.data_ = uVar2;
        *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 8) = uVar3;
        this->RecentConnection = pIVar12;
        goto LAB_0012a08f;
      }
    }
  }
  pIVar12 = (IConnection *)0x0;
LAB_0012a16d:
  pthread_mutex_unlock((pthread_mutex_t *)&this->AddressMapLock);
  return pIVar12;
}

Assistant:

IConnection* ConnectionAddrMap::FindByAddr(const UDPAddress& addr)
{
    TONK_DEBUG_ASSERT(!addr.address().is_unspecified());

    Locker locker(AddressMapLock);

    IConnection* connection;

    if (addr == RecentAddress) {
        connection = RecentConnection;
    }
    else
    {
        connection = AddressMap.Find(addr);
        if (connection)
        {
            RecentAddress = addr;
            RecentConnection = connection;
        }
    }

    if (connection) {
        connection->SelfRefCount.IncrementReferences();
    }
    return connection;
}